

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O0

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileInitGlobal
           (ClientContext *context,TableFunctionInitInput *input)

{
  optional_ptr<duckdb::TableFilterSet,_true> table_filters;
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  byte bVar4;
  __type_conflict5 _Var5;
  pointer pMVar6;
  pointer pMVar7;
  size_type sVar8;
  size_type sVar9;
  TableFilterSet *ptr_p;
  unsigned_long uVar10;
  BaseUnionData *this;
  BaseFileReader *pBVar11;
  pointer pMVar12;
  MultiFileList *pMVar13;
  idx_t b;
  reference pvVar14;
  InternalException *pIVar15;
  pointer this_00;
  long in_RDX;
  ClientContext *in_RSI;
  unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  in_RDI;
  MultiFileGlobalState *global_state;
  LogicalType *column_type;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<duckdb::LogicalType,_true> *__range3_1;
  iterator entry;
  idx_t column_id;
  ColumnIndex *col_idx;
  iterator __end3;
  iterator __begin3;
  vector<duckdb::ColumnIndex,_true> *__range3;
  vector<duckdb::LogicalType,_true> table_types;
  idx_t i;
  bool require_extra_columns;
  optional_idx max_threads;
  FileExpandResult expand_result;
  ReaderInitializeType init_result;
  idx_t file_idx;
  OpenFileInfo file_name;
  unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
  *reader_data;
  iterator __end2;
  iterator __begin2;
  vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
  *__range2;
  shared_ptr<duckdb::BaseUnionData,_true> *reader;
  iterator __end4;
  iterator __begin4;
  vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true> *__range4;
  vector<duckdb::MultiFileColumnDefinition,_true> *global_columns;
  MultiFileList *file_list;
  unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true> new_list;
  unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
  result;
  MultiFileBindData *bind_data;
  unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
  *in_stack_fffffffffffffa58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  optional_ptr<const_duckdb::FunctionData,_true> *in_stack_fffffffffffffa60;
  MultiFileBindData *in_stack_fffffffffffffa68;
  MultiFileBindData *in_stack_fffffffffffffa70;
  ClientContext *in_stack_fffffffffffffa78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa80;
  shared_ptr<duckdb::BaseFileReader,_true> *in_stack_fffffffffffffa88;
  ClientContext *in_stack_fffffffffffffa90;
  vector<duckdb::ColumnIndex,_true> *in_stack_fffffffffffffa98;
  MultiFileBindData *in_stack_fffffffffffffaa0;
  MultiFileReaderData *in_stack_fffffffffffffaa8;
  optional_ptr<duckdb::MultiFileReaderGlobalState,_true> in_stack_fffffffffffffab0;
  allocator *paVar16;
  optional_idx in_stack_fffffffffffffab8;
  undefined7 in_stack_fffffffffffffac0;
  undefined1 in_stack_fffffffffffffac7;
  ClientContext *in_stack_fffffffffffffac8;
  optional_ptr<duckdb::TableFilterSet,_true> in_stack_fffffffffffffad0;
  bool local_4d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
  local_278;
  pointer local_270;
  undefined1 local_262;
  allocator local_261;
  string local_260 [32];
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false> local_240;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false> local_238;
  idx_t local_230;
  ColumnIndex *local_228;
  ColumnIndex *local_220;
  __normal_iterator<duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
  local_218;
  long local_210;
  ulong local_1f0;
  bool local_1e1;
  optional_idx local_1e0;
  undefined1 local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  undefined8 local_1c0;
  ReaderInitializeType local_1b8;
  undefined1 local_1b2;
  allocator local_1b1;
  string local_1b0 [38];
  undefined1 local_18a;
  allocator local_189;
  string local_188 [32];
  idx_t local_168;
  reference local_130;
  unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
  *local_128;
  __normal_iterator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>_>
  local_120;
  vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
  *local_118;
  optional_ptr<duckdb::TableFilterSet,_true> local_108 [8];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  reference local_a8;
  shared_ptr<duckdb::BaseUnionData,_true> *local_a0;
  __normal_iterator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>_>
  local_98;
  vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true> *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  MultiFileList *local_60;
  undefined8 local_38;
  MultiFileBindData *local_20;
  long local_18;
  ClientContext *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  optional_ptr<const_duckdb::FunctionData,_true>::operator->(in_stack_fffffffffffffa60);
  local_20 = FunctionData::CastNoConst<duckdb::MultiFileBindData>((FunctionData *)0x6507f7);
  unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
  ::unique_ptr((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                *)0x65080c);
  local_38 = *(undefined8 *)(local_18 + 0x50);
  MultiFileFilterPushdown
            (in_stack_fffffffffffffac8,
             (MultiFileBindData *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
             (vector<unsigned_long,_true> *)in_stack_fffffffffffffab8.index,
             in_stack_fffffffffffffad0);
  bVar3 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>
                      *)0x65085b);
  if (bVar3) {
    make_uniq<duckdb::MultiFileGlobalState,duckdb::unique_ptr<duckdb::MultiFileList,std::default_delete<duckdb::MultiFileList>,true>>
              ((unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true>
                *)in_stack_fffffffffffffa98);
    unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
    ::operator=((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                 *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                   *)0x65089a);
  }
  else {
    shared_ptr<duckdb::MultiFileList,_true>::operator*
              ((shared_ptr<duckdb::MultiFileList,_true> *)in_stack_fffffffffffffa60);
    make_uniq<duckdb::MultiFileGlobalState,duckdb::MultiFileList&>
              ((MultiFileList *)in_stack_fffffffffffffa78);
    unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
    ::operator=((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                 *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                   *)0x650925);
  }
  pMVar6 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                         *)in_stack_fffffffffffffa60);
  pMVar13 = pMVar6->file_list;
  local_60 = pMVar13;
  unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
  ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                *)in_stack_fffffffffffffa60);
  duckdb::MultiFileList::InitializeScan((MultiFileListScanData *)pMVar13);
  bVar3 = std::
          vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
          ::empty((vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                   *)in_stack_fffffffffffffa70);
  if (bVar3) {
    local_2c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &local_20->columns;
  }
  else {
    local_2c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &(local_20->reader_bind).schema;
  }
  local_68 = local_2c0;
  pMVar7 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>::
           operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                       *)in_stack_fffffffffffffa60);
  global_state = (MultiFileGlobalState *)(local_18 + 0x20);
  __rhs = local_68;
  (**(code **)(*(long *)pMVar7 + 0x48))
            (local_70,pMVar7,local_10,&local_20->file_options,&local_20->reader_bind,local_60);
  unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
  ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                *)global_state);
  unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>,_true>
  ::operator=((unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>,_true>
               *)global_state,
              (unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>,_true>
               *)__rhs);
  unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>,_true>
                 *)0x650aaa);
  bVar4 = duckdb::MultiFileList::IsEmpty();
  if ((bVar4 & 1) == 0) {
    bVar3 = std::
            vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
            ::empty((vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
                     *)in_stack_fffffffffffffa70);
    if (bVar3) {
      bVar3 = duckdb::shared_ptr::operator_cast_to_bool
                        ((shared_ptr<duckdb::BaseFileReader,_true> *)0x650db5);
      if (bVar3) {
        pBVar11 = shared_ptr<duckdb::BaseFileReader,_true>::operator->
                            ((shared_ptr<duckdb::BaseFileReader,_true> *)global_state);
        BaseFileReader::GetFileName_abi_cxx11_(pBVar11);
        duckdb::MultiFileList::GetFirstFile();
        _Var5 = std::operator==(in_stack_fffffffffffffa80,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffa78);
        OpenFileInfo::~OpenFileInfo((OpenFileInfo *)global_state);
        if (_Var5) {
          unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
          ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                        *)global_state);
          make_uniq<duckdb::MultiFileReaderData,duckdb::shared_ptr<duckdb::BaseFileReader,true>>
                    (in_stack_fffffffffffffa88);
          std::
          vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
          ::push_back((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                       *)global_state,(value_type *)__rhs);
          unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
          ::~unique_ptr((unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                         *)0x650eb0);
        }
      }
    }
    else {
      local_90 = &local_20->union_readers;
      local_98._M_current =
           (shared_ptr<duckdb::BaseUnionData,_true> *)
           std::
           vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
           ::begin((vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
                    *)__rhs);
      local_a0 = (shared_ptr<duckdb::BaseUnionData,_true> *)
                 std::
                 vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
                 ::end((vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
                        *)__rhs);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>_>
                                 *)global_state,
                                (__normal_iterator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>_>
                                 *)__rhs), bVar3) {
        local_a8 = __gnu_cxx::
                   __normal_iterator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>_>
                   ::operator*(&local_98);
        unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
        ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                      *)global_state);
        make_uniq<duckdb::MultiFileReaderData,duckdb::shared_ptr<duckdb::BaseUnionData,true>&>
                  ((shared_ptr<duckdb::BaseUnionData,_true> *)in_stack_fffffffffffffa88);
        std::
        vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
        ::push_back((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                     *)global_state,(value_type *)__rhs);
        unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
        ::~unique_ptr((unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                       *)0x650c77);
        __gnu_cxx::
        __normal_iterator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>_>
        ::operator++(&local_98);
      }
      pMVar6 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
               ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                             *)global_state);
      sVar8 = std::
              vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
              ::size(&(pMVar6->readers).
                      super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                    );
      sVar9 = (**(code **)(*(idx_t *)local_60 + 0x30))();
      if (sVar8 != sVar9) {
        local_c8 = 0;
        uStack_c0 = 0;
        local_b8 = 0;
        vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
        ::vector((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
                  *)0x650d37);
        unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
        ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                      *)global_state);
        vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
        ::operator=((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
                     *)global_state,
                    (vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
                     *)__rhs);
        vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
        ::~vector((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
                   *)0x650d74);
      }
    }
  }
  else {
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
    ::vector((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
              *)0x650af4);
    unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
    ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                  *)global_state);
    vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
    ::operator=((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
                 *)global_state,
                (vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
                 *)__rhs);
    vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
    ::~vector((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
               *)0x650b31);
  }
  unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
  ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                *)global_state);
  std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffa70,
             (__int_type)in_stack_fffffffffffffa68);
  unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
  ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                *)global_state);
  vector<duckdb::ColumnIndex,_true>::operator=
            ((vector<duckdb::ColumnIndex,_true> *)global_state,
             (vector<duckdb::ColumnIndex,_true> *)__rhs);
  ptr_p = optional_ptr<duckdb::TableFilterSet,_true>::get
                    ((optional_ptr<duckdb::TableFilterSet,_true> *)(local_18 + 0x50));
  optional_ptr<duckdb::TableFilterSet,_true>::optional_ptr(local_108,ptr_p);
  pMVar6 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                         *)global_state);
  (pMVar6->filters).ptr = local_108[0].ptr;
  unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
  ::operator*((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
               *)global_state);
  ParquetMultiFileInfo::InitializeGlobalState
            (in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
             (MultiFileGlobalState *)in_stack_fffffffffffffa68);
  unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
  ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                *)global_state);
  unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
  ::operator=((unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
               *)global_state,
              (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
               *)__rhs);
  unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
  ::~unique_ptr((unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
                 *)0x651059);
  duckdb::TaskScheduler::GetScheduler(local_10);
  duckdb::TaskScheduler::NumberOfThreads();
  uVar10 = NumericCast<unsigned_long,int,void>(0);
  pMVar6 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                         *)global_state);
  pMVar6->max_threads = uVar10;
  pMVar6 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                         *)global_state);
  local_118 = &pMVar6->readers;
  local_120._M_current =
       (unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
        *)std::
          vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
          ::begin((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                   *)__rhs);
  local_128 = (unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
               *)std::
                 vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                 ::end((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                        *)__rhs);
  do {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>_>
                        *)global_state,
                       (__normal_iterator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>_>
                        *)__rhs);
    if (!bVar3) {
      pMVar13 = shared_ptr<duckdb::MultiFileList,_true>::operator->
                          ((shared_ptr<duckdb::MultiFileList,_true> *)global_state);
      local_1d1 = (**(code **)(*(long *)pMVar13 + 0x28))();
      unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
      ::operator*((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                   *)global_state);
      local_1e0 = ParquetMultiFileInfo::MaxThreads
                            (in_stack_fffffffffffffa68,global_state,
                             (FileExpandResult)((ulong)__rhs >> 0x38));
      bVar3 = optional_idx::IsValid(&local_1e0);
      if (bVar3) {
        pMVar6 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                 ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                               *)global_state);
        uVar10 = pMVar6->max_threads;
        b = optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffffaa0);
        uVar10 = MinValue<unsigned_long>(uVar10,b);
        pMVar6 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                 ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                               *)global_state);
        pMVar6->max_threads = uVar10;
      }
      unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
      ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                    *)global_state);
      bVar3 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
                          *)0x651809);
      local_4d1 = false;
      if (bVar3) {
        unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
        ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                      *)global_state);
        unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>,_true>
        ::operator->((unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>,_true>
                      *)global_state);
        local_4d1 = MultiFileReaderGlobalState::RequiresExtraColumns
                              ((MultiFileReaderGlobalState *)0x65185a);
      }
      local_1e1 = local_4d1;
      bVar3 = TableFunctionInitInput::CanRemoveFilterColumns
                        ((TableFunctionInitInput *)in_stack_fffffffffffffa68);
      if ((bVar3) || ((local_1e1 & 1U) != 0)) {
        bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffa70);
        if (bVar3) {
          unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
          ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                        *)global_state);
          std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::size
                    ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
                     (local_18 + 0x20));
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffa80,(size_type)in_stack_fffffffffffffa78);
          for (local_1f0 = 0; uVar1 = local_1f0,
              sVar8 = std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::size
                                ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                  *)(local_18 + 0x20)), uVar2 = local_1f0, uVar1 < sVar8;
              local_1f0 = local_1f0 + 1) {
            unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)global_state);
            pvVar14 = vector<unsigned_long,_true>::operator[]
                                ((vector<unsigned_long,_true> *)global_state,(size_type)__rhs);
            *pvVar14 = uVar2;
          }
        }
        else {
          unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
          ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                        *)global_state);
          vector<unsigned_long,_true>::operator=
                    ((vector<unsigned_long,_true> *)global_state,
                     (vector<unsigned_long,_true> *)__rhs);
        }
        vector<duckdb::LogicalType,_true>::vector
                  ((vector<duckdb::LogicalType,_true> *)global_state,
                   (vector<duckdb::LogicalType,_true> *)__rhs);
        local_210 = local_18 + 0x20;
        local_218._M_current =
             (ColumnIndex *)
             std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::begin
                       ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)__rhs);
        local_220 = (ColumnIndex *)
                    std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::end
                              ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
                               __rhs);
        while (bVar3 = __gnu_cxx::operator!=
                                 ((__normal_iterator<duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
                                   *)global_state,
                                  (__normal_iterator<duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
                                   *)__rhs), bVar3) {
          local_228 = __gnu_cxx::
                      __normal_iterator<duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
                      ::operator*(&local_218);
          local_230 = ColumnIndex::GetPrimaryIndex(local_228);
          bVar3 = ColumnIndex::IsVirtualColumn(local_228);
          if (bVar3) {
            local_238._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                 ::find((unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                         *)__rhs,(key_type *)0x651b05);
            local_240._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                 ::end((unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                        *)__rhs);
            bVar3 = std::__detail::operator==(&local_238,&local_240);
            if (bVar3) {
              local_262 = 1;
              pIVar15 = (InternalException *)__cxa_allocate_exception(0x10);
              paVar16 = &local_261;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_260,"MultiFileReader - virtual column definition not found",paVar16);
              duckdb::InternalException::InternalException(pIVar15,local_260);
              local_262 = 0;
              __cxa_throw(pIVar15,&InternalException::typeinfo,InternalException::~InternalException
                         );
            }
            unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)global_state);
            std::__detail::
            _Node_iterator<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false,_false>::
            operator->((_Node_iterator<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false,_false>
                        *)0x651c79);
            std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
            emplace_back<duckdb::LogicalType&>
                      ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                       in_stack_fffffffffffffa70,(LogicalType *)in_stack_fffffffffffffa68);
          }
          else {
            unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)global_state);
            vector<duckdb::LogicalType,_true>::operator[]
                      ((vector<duckdb::LogicalType,_true> *)global_state,(size_type)__rhs);
            std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                      ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                       in_stack_fffffffffffffa70,(value_type *)in_stack_fffffffffffffa68);
          }
          __gnu_cxx::
          __normal_iterator<duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
          ::operator++(&local_218);
        }
        vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x651d02);
      }
      if ((local_1e1 & 1U) != 0) {
        unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
        ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                      *)global_state);
        this_00 = unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>,_true>
                  ::operator->((unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>,_true>
                                *)global_state);
        local_270 = this_00 + 8;
        local_278._M_current =
             (LogicalType *)
             std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::begin
                       ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)__rhs);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)__rhs);
        while (bVar3 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                                   *)global_state,
                                  (__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                                   *)__rhs), bVar3) {
          __gnu_cxx::
          __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
          ::operator*(&local_278);
          pMVar6 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                   ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                 *)global_state);
          std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_00,
                     (value_type *)pMVar6);
          __gnu_cxx::
          __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
          ::operator++(&local_278);
        }
      }
      unique_ptr<duckdb::GlobalTableFunctionState,std::default_delete<duckdb::GlobalTableFunctionState>,true>
      ::
      unique_ptr<duckdb::MultiFileGlobalState,std::default_delete<std::unique_ptr<duckdb::GlobalTableFunctionState,std::default_delete<duckdb::GlobalTableFunctionState>>>,void>
                ((unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
                  *)global_state,
                 (unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
                  *)__rhs);
      unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true>::
      ~unique_ptr((unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true>
                   *)0x651e1c);
      unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
      ::~unique_ptr((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                     *)0x651e29);
      return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
              )(__uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
                )in_RDI._M_t.
                 super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
                 .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
    }
    local_130 = __gnu_cxx::
                __normal_iterator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>_>
                ::operator*(&local_120);
    OpenFileInfo::OpenFileInfo((OpenFileInfo *)in_stack_fffffffffffffa70);
    pMVar6 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
             ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                           *)global_state);
    pMVar13 = local_60;
    local_168 = (pMVar6->file_list_scan).current_file_idx;
    pMVar6 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
             ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                           *)global_state);
    duckdb::MultiFileList::Scan
              ((MultiFileListScanData *)pMVar13,(OpenFileInfo *)&pMVar6->file_list_scan);
    unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
    ::operator->((unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                  *)global_state);
    bVar3 = duckdb::shared_ptr::operator_cast_to_bool
                      ((shared_ptr<duckdb::BaseUnionData,_true> *)0x6511fe);
    if (bVar3) {
      unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
      ::operator->((unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                    *)global_state);
      this = shared_ptr<duckdb::BaseUnionData,_true>::operator->
                       ((shared_ptr<duckdb::BaseUnionData,_true> *)global_state);
      BaseUnionData::GetFileName_abi_cxx11_(this);
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              global_state,__rhs);
      if (bVar3) {
        local_18a = 1;
        pIVar15 = (InternalException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_188,"Mismatch in filename order and union reader order in multi file scan",
                   &local_189);
        duckdb::InternalException::InternalException(pIVar15,local_188);
        local_18a = 0;
        __cxa_throw(pIVar15,&InternalException::typeinfo,InternalException::~InternalException);
      }
    }
    else {
      unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
      ::operator->((unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                    *)global_state);
      pBVar11 = shared_ptr<duckdb::BaseFileReader,_true>::operator->
                          ((shared_ptr<duckdb::BaseFileReader,_true> *)global_state);
      BaseFileReader::GetFileName_abi_cxx11_(pBVar11);
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              global_state,__rhs);
      if (bVar3) {
        local_1b2 = 1;
        pIVar15 = (InternalException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1b0,"Mismatch in filename order and reader order in multi file scan",
                   &local_1b1);
        duckdb::InternalException::InternalException(pIVar15,local_1b0);
        local_1b2 = 0;
        __cxa_throw(pIVar15,&InternalException::typeinfo,InternalException::~InternalException);
      }
      unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
      ::operator*((unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                   *)global_state);
      local_1c0 = *(undefined8 *)(local_18 + 0x50);
      optional_idx::optional_idx
                ((optional_idx *)in_stack_fffffffffffffaa0,(idx_t)in_stack_fffffffffffffa98);
      unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
      ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                    *)global_state);
      optional_ptr<duckdb::MultiFileReaderGlobalState,_true>::optional_ptr
                ((optional_ptr<duckdb::MultiFileReaderGlobalState,_true> *)global_state,
                 (unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>,_true>
                  *)__rhs);
      table_filters.ptr._7_1_ = in_stack_fffffffffffffac7;
      table_filters.ptr._0_7_ = in_stack_fffffffffffffac0;
      __rhs = local_1d0;
      local_1b8 = InitializeReader(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                                   in_stack_fffffffffffffa98,table_filters,in_stack_fffffffffffffa90
                                   ,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
      if (local_1b8 == SKIP_READING_FILE) {
        pMVar12 = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                  ::operator->((unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                                *)global_state);
        pMVar12->file_state = SKIPPED;
        pMVar6 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                 ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                               *)global_state);
        std::__atomic_base<unsigned_long>::operator++
                  (&(pMVar6->file_index).super___atomic_base<unsigned_long>,0);
      }
    }
    OpenFileInfo::~OpenFileInfo((OpenFileInfo *)global_state);
    __gnu_cxx::
    __normal_iterator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>_>
    ::operator++(&local_120);
  } while( true );
}

Assistant:

static unique_ptr<GlobalTableFunctionState> MultiFileInitGlobal(ClientContext &context,
	                                                                TableFunctionInitInput &input) {
		auto &bind_data = input.bind_data->CastNoConst<MultiFileBindData>();
		unique_ptr<MultiFileGlobalState> result;

		// before instantiating a scan trigger a dynamic filter pushdown if possible
		auto new_list = MultiFileFilterPushdown(context, bind_data, input.column_ids, input.filters);
		if (new_list) {
			result = make_uniq<MultiFileGlobalState>(std::move(new_list));
		} else {
			result = make_uniq<MultiFileGlobalState>(*bind_data.file_list);
		}
		auto &file_list = result->file_list;
		file_list.InitializeScan(result->file_list_scan);

		auto &global_columns = bind_data.reader_bind.schema.empty() ? bind_data.columns : bind_data.reader_bind.schema;
		result->multi_file_reader_state = bind_data.multi_file_reader->InitializeGlobalState(
		    context, bind_data.file_options, bind_data.reader_bind, file_list, global_columns, input.column_indexes);

		if (file_list.IsEmpty()) {
			result->readers = {};
		} else if (!bind_data.union_readers.empty()) {
			for (auto &reader : bind_data.union_readers) {
				result->readers.push_back(make_uniq<MultiFileReaderData>(reader));
			}
			if (result->readers.size() != file_list.GetTotalFileCount()) {
				result->readers = {};
			}
		} else if (bind_data.initial_reader) {
			// we can only use the initial reader if it was constructed from the first file
			if (bind_data.initial_reader->GetFileName() == file_list.GetFirstFile().path) {
				result->readers.push_back(make_uniq<MultiFileReaderData>(std::move(bind_data.initial_reader)));
			}
		}

		result->file_index = 0;
		result->column_indexes = input.column_indexes;
		result->filters = input.filters.get();
		result->global_state = OP::InitializeGlobalState(context, bind_data, *result);
		result->max_threads = NumericCast<idx_t>(TaskScheduler::GetScheduler(context).NumberOfThreads());

		// Ensure all readers are initialized and FileListScan is sync with readers list
		for (auto &reader_data : result->readers) {
			OpenFileInfo file_name;
			idx_t file_idx = result->file_list_scan.current_file_idx;
			file_list.Scan(result->file_list_scan, file_name);
			if (reader_data->union_data) {
				if (file_name.path != reader_data->union_data->GetFileName()) {
					throw InternalException("Mismatch in filename order and union reader order in multi file scan");
				}
			} else {
				D_ASSERT(reader_data->reader);
				if (file_name.path != reader_data->reader->GetFileName()) {
					throw InternalException("Mismatch in filename order and reader order in multi file scan");
				}
				auto init_result = InitializeReader(*reader_data, bind_data, input.column_indexes, input.filters,
				                                    context, file_idx, result->multi_file_reader_state);
				if (init_result == ReaderInitializeType::SKIP_READING_FILE) {
					//! File can be skipped entirely, close it and move on
					reader_data->file_state = MultiFileFileState::SKIPPED;
					result->file_index++;
				}
			}
		}

		auto expand_result = bind_data.file_list->GetExpandResult();
		auto max_threads = OP::MaxThreads(bind_data, *result, expand_result);
		if (max_threads.IsValid()) {
			result->max_threads = MinValue<idx_t>(result->max_threads, max_threads.GetIndex());
		}
		bool require_extra_columns =
		    result->multi_file_reader_state && result->multi_file_reader_state->RequiresExtraColumns();
		if (input.CanRemoveFilterColumns() || require_extra_columns) {
			if (!input.projection_ids.empty()) {
				result->projection_ids = input.projection_ids;
			} else {
				result->projection_ids.resize(input.column_indexes.size());
				for (idx_t i = 0; i < input.column_indexes.size(); i++) {
					result->projection_ids[i] = i;
				}
			}

			const auto table_types = bind_data.types;
			for (const auto &col_idx : input.column_indexes) {
				auto column_id = col_idx.GetPrimaryIndex();
				if (col_idx.IsVirtualColumn()) {
					auto entry = bind_data.virtual_columns.find(column_id);
					if (entry == bind_data.virtual_columns.end()) {
						throw InternalException("MultiFileReader - virtual column definition not found");
					}
					result->scanned_types.emplace_back(entry->second.type);
				} else {
					result->scanned_types.push_back(table_types[column_id]);
				}
			}
		}
		if (require_extra_columns) {
			for (const auto &column_type : result->multi_file_reader_state->extra_columns) {
				result->scanned_types.push_back(column_type);
			}
		}
		return std::move(result);
	}